

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTContext.cpp
# Opt level: O0

ASTContext * __thiscall
slang::ast::ASTContext::resetFlags(ASTContext *this,bitmask<slang::ast::ASTFlags> addedFlags)

{
  void *in_RSI;
  ASTContext *in_RDI;
  ASTContext *result;
  ASTContext *this_00;
  bitmask<slang::ast::ASTFlags> local_18 [2];
  bitmask<slang::ast::ASTFlags> local_8;
  
  this_00 = in_RDI;
  memcpy(in_RDI,in_RSI,0x38);
  local_18[0] = bitmask<slang::ast::ASTFlags>::operator~((bitmask<slang::ast::ASTFlags> *)this_00);
  bitmask<slang::ast::ASTFlags>::operator&=(&this_00->flags,local_18);
  bitmask<slang::ast::ASTFlags>::operator|=(&this_00->flags,&local_8);
  return in_RDI;
}

Assistant:

ASTContext ASTContext::resetFlags(bitmask<ASTFlags> addedFlags) const {
    // Remove non-sticky flags, add in any extras specified by addedFlags
    static constexpr bitmask<ASTFlags> NonSticky =
        ASTFlags::InsideConcatenation | ASTFlags::AllowDataType | ASTFlags::AssignmentAllowed |
        ASTFlags::StreamingAllowed | ASTFlags::TopLevelStatement | ASTFlags::AllowUnboundedLiteral |
        ASTFlags::AllowTypeReferences | ASTFlags::AllowClockingBlock | ASTFlags::NotADriver |
        ASTFlags::AssertionDefaultArg;

    ASTContext result(*this);
    result.flags &= ~NonSticky;
    result.flags |= addedFlags;
    return result;
}